

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

bool SplitHostPort(string_view in,uint16_t *portOut,string *hostOut)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  ulong __len2;
  ulong uVar4;
  char *__s;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  string_view str;
  uint16_t n;
  uint16_t local_3a;
  long local_38;
  ulong uVar5;
  
  __s = in._M_str;
  __len2 = in._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = __len2;
  if (__len2 == 0) {
LAB_00155e87:
    uVar4 = 0xffffffffffffffff;
  }
  else {
    do {
      uVar4 = uVar5 - 1;
      if (uVar5 == 0) goto LAB_00155e87;
      lVar1 = uVar5 - 1;
      uVar5 = uVar4;
    } while (__s[lVar1] != ':');
  }
  if ((uVar4 == 0xffffffffffffffff) || (*__s != '[')) {
    bVar6 = false;
  }
  else {
    bVar6 = __s[uVar4 - 1] == ']';
  }
  bVar8 = true;
  bVar7 = true;
  if ((__len2 != 0) && (uVar5 = uVar4 - 1, uVar5 < 0xfffffffffffffffe)) {
    uVar3 = __len2 - 1;
    if (uVar5 < __len2 - 1) {
      uVar3 = uVar5;
    }
    do {
      bVar7 = uVar3 == 0xffffffffffffffff;
      if (bVar7) break;
      pcVar2 = __s + uVar3;
      uVar3 = uVar3 - 1;
    } while (*pcVar2 != ':');
  }
  if ((uVar4 != 0xffffffffffffffff) && ((bool)(uVar4 == 0 | bVar6 | bVar7))) {
    lVar1 = uVar4 + 1;
    if (__len2 <= uVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   lVar1,__len2);
      }
      goto LAB_00155fb6;
    }
    str._M_len = __len2 - lVar1;
    str._M_str = __s + lVar1;
    bVar6 = ParseUInt16(str,&local_3a);
    if (bVar6) {
      if (uVar4 <= __len2) {
        __len2 = uVar4;
      }
      *portOut = local_3a;
      bVar8 = local_3a != 0;
    }
    else {
      bVar8 = false;
    }
  }
  if (((__len2 != 0) && (*__s == '[')) && (__s[__len2 - 1] == ']')) {
    uVar5 = __len2 - 2;
    __len2 = __len2 - 1;
    if (uVar5 <= __len2) {
      __len2 = uVar5;
    }
    __s = __s + 1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (hostOut,0,hostOut->_M_string_length,__s,__len2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
LAB_00155fb6:
  __stack_chk_fail();
}

Assistant:

bool SplitHostPort(std::string_view in, uint16_t& portOut, std::string& hostOut)
{
    bool valid = false;
    size_t colon = in.find_last_of(':');
    // if a : is found, and it either follows a [...], or no other : is in the string, treat it as port separator
    bool fHaveColon = colon != in.npos;
    bool fBracketed = fHaveColon && (in[0] == '[' && in[colon - 1] == ']'); // if there is a colon, and in[0]=='[', colon is not 0, so in[colon-1] is safe
    bool fMultiColon{fHaveColon && colon != 0 && (in.find_last_of(':', colon - 1) != in.npos)};
    if (fHaveColon && (colon == 0 || fBracketed || !fMultiColon)) {
        uint16_t n;
        if (ParseUInt16(in.substr(colon + 1), &n)) {
            in = in.substr(0, colon);
            portOut = n;
            valid = (portOut != 0);
        }
    } else {
        valid = true;
    }
    if (in.size() > 0 && in[0] == '[' && in[in.size() - 1] == ']') {
        hostOut = in.substr(1, in.size() - 2);
    } else {
        hostOut = in;
    }

    return valid;
}